

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::SetImportLocationProperty
          (cmExportInstallFileGenerator *this,string *config,string *suffix,
          cmInstallTargetGenerator *itgen,ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  string *__return_storage_ptr__;
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *target_00;
  cmGeneratorTarget *this_00;
  mapped_type *pmVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string local_278;
  string local_258;
  string local_238;
  undefined1 local_218 [8];
  string prop_2;
  string local_1e8;
  undefined1 local_1c8 [8];
  string importValue;
  string importProp;
  string local_178;
  string local_158;
  reference local_138;
  string *obj;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string prop_1;
  string local_d0;
  undefined1 local_b0 [8];
  string prop;
  undefined1 local_80 [8];
  string value;
  string dest;
  cmGeneratorTarget *target;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *importedLocations_local;
  ImportPropertyMap *properties_local;
  cmInstallTargetGenerator *itgen_local;
  string *suffix_local;
  string *config_local;
  cmExportInstallFileGenerator *this_local;
  
  if ((itgen != (cmInstallTargetGenerator *)0x0) &&
     (bVar1 = cmInstallGenerator::InstallsForConfig(&itgen->super_cmInstallGenerator,config), bVar1)
     ) {
    target_00 = cmInstallTargetGenerator::GetTarget(itgen);
    __return_storage_ptr__ = (string *)((long)&value.field_2 + 8);
    cmInstallTargetGenerator::GetDestination(__return_storage_ptr__,itgen,config);
    std::__cxx11::string::string((string *)local_80);
    bVar1 = cmsys::SystemTools::FileIsFullPath(__return_storage_ptr__);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)local_80,"${_IMPORT_PREFIX}/");
    }
    std::__cxx11::string::operator+=((string *)local_80,(string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_80,"/");
    bVar1 = cmInstallTargetGenerator::IsImportLibrary(itgen);
    if (bVar1) {
      cmStrCat<char_const(&)[16],std::__cxx11::string_const&>
                ((string *)local_b0,(char (*) [16])0xfee84c,suffix);
      cmInstallTargetGenerator::GetInstallFilename(&local_d0,target_00,config,NameImplibReal);
      std::__cxx11::string::operator+=((string *)local_80,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,(key_type *)local_b0);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_80);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(importedLocations,(value_type *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      this_00 = cmInstallTargetGenerator::GetTarget(itgen);
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (TVar2 == OBJECT_LIBRARY) {
        cmStrCat<char_const(&)[17],std::__cxx11::string_const&>
                  ((string *)
                   &objects.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (char (*) [17])"IMPORTED_OBJECTS",suffix);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3);
        cmInstallTargetGenerator::GetInstallObjectNames
                  (itgen,config,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
        obj = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&obj), bVar1) {
          local_138 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                    (&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     local_138);
          std::__cxx11::string::operator=((string *)local_138,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        cmList::
        to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  (&local_178,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,
                              (key_type *)
                              &objects.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(importedLocations,
                 (value_type *)
                 &objects.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3);
        std::__cxx11::string::~string
                  ((string *)
                   &objects.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        bVar1 = cmGeneratorTarget::IsFrameworkOnApple(target_00);
        if ((bVar1) && (bVar1 = cmGeneratorTarget::HasImportLibrary(target_00,config), bVar1)) {
          cmStrCat<char_const(&)[16],std::__cxx11::string_const&>
                    ((string *)((long)&importValue.field_2 + 8),(char (*) [16])0xfee84c,suffix);
          cmInstallTargetGenerator::GetInstallFilename(&local_1e8,target_00,config,NameImplibReal);
          cmStrCat<std::__cxx11::string&,std::__cxx11::string>
                    ((string *)local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     &local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,(key_type *)((long)&importValue.field_2 + 8));
          std::__cxx11::string::operator=((string *)pmVar3,(string *)local_1c8);
          pVar4 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(importedLocations,(value_type *)((long)&importValue.field_2 + 8));
          prop_2.field_2._8_8_ = pVar4.first._M_node;
          std::__cxx11::string::~string((string *)local_1c8);
          std::__cxx11::string::~string((string *)(importValue.field_2._M_local_buf + 8));
        }
        cmStrCat<char_const(&)[18],std::__cxx11::string_const&>
                  ((string *)local_218,(char (*) [18])"IMPORTED_LOCATION",suffix);
        bVar1 = cmGeneratorTarget::IsAppBundleOnApple(target_00);
        if (bVar1) {
          cmInstallTargetGenerator::GetInstallFilename(&local_238,target_00,config,NameNormal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::operator+=((string *)local_80,".app/");
          bVar1 = cmMakefile::PlatformIsAppleEmbedded(target_00->Makefile);
          if (!bVar1) {
            std::__cxx11::string::operator+=((string *)local_80,"Contents/MacOS/");
          }
          cmInstallTargetGenerator::GetInstallFilename(&local_258,target_00,config,NameNormal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_258);
          std::__cxx11::string::~string((string *)&local_258);
        }
        else {
          cmInstallTargetGenerator::GetInstallFilename(&local_278,target_00,config,NameReal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_278);
          std::__cxx11::string::~string((string *)&local_278);
        }
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)local_218);
        std::__cxx11::string::operator=((string *)pmVar3,(string *)local_80);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(importedLocations,(value_type *)local_218);
        std::__cxx11::string::~string((string *)local_218);
      }
    }
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmInstallTargetGenerator* itgen, ImportPropertyMap& properties,
  std::set<std::string>& importedLocations)
{
  // Skip rules that do not match this configuration.
  if (!(itgen && itgen->InstallsForConfig(config))) {
    return;
  }

  // Get the target to be installed.
  cmGeneratorTarget* target = itgen->GetTarget();

  // Construct the installed location of the target.
  std::string dest = itgen->GetDestination(config);
  std::string value;
  if (!cmSystemTools::FileIsFullPath(dest)) {
    // The target is installed relative to the installation prefix.
    value = "${_IMPORT_PREFIX}/";
  }
  value += dest;
  value += "/";

  if (itgen->IsImportLibrary()) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_IMPLIB", suffix);

    // Append the installed file name.
    value += cmInstallTargetGenerator::GetInstallFilename(
      target, config, cmInstallTargetGenerator::NameImplibReal);

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  } else if (itgen->GetTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_OBJECTS", suffix);

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<std::string> objects;
    itgen->GetInstallObjectNames(config, objects);
    for (std::string& obj : objects) {
      obj = cmStrCat(value, obj);
    }

    // Store the property.
    properties[prop] = cmList::to_string(objects);
    importedLocations.insert(prop);
  } else {
    if (target->IsFrameworkOnApple() && target->HasImportLibrary(config)) {
      // store as well IMPLIB value
      auto importProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      auto importValue =
        cmStrCat(value,
                 cmInstallTargetGenerator::GetInstallFilename(
                   target, config, cmInstallTargetGenerator::NameImplibReal));

      // Store the property.
      properties[importProp] = importValue;
      importedLocations.insert(importProp);
    }

    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_LOCATION", suffix);

    // Append the installed file name.
    if (target->IsAppBundleOnApple()) {
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
      value += ".app/";
      if (!target->Makefile->PlatformIsAppleEmbedded()) {
        value += "Contents/MacOS/";
      }
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
    } else {
      value += cmInstallTargetGenerator::GetInstallFilename(
        target, config, cmInstallTargetGenerator::NameReal);
    }

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  }
}